

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector4 Vector4Normalize(Vector4 v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar6;
  undefined8 uVar5;
  float fVar7;
  float fVar8;
  Vector4 VVar9;
  
  fVar4 = v.z;
  fVar6 = v.w;
  fVar1 = v.x;
  fVar3 = v.y;
  fVar2 = fVar6 * fVar6 + fVar4 * fVar4 + fVar1 * fVar1 + fVar3 * fVar3;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar7 = 0.0;
  fVar8 = 0.0;
  uVar5 = 0;
  if (0.0 < fVar2) {
    fVar2 = 1.0 / fVar2;
    fVar7 = fVar1 * fVar2;
    fVar8 = fVar3 * fVar2;
    uVar5 = CONCAT44(fVar2 * fVar6,fVar4 * fVar2);
  }
  VVar9.y = fVar8;
  VVar9.x = fVar7;
  VVar9.z = (float)(int)uVar5;
  VVar9.w = (float)(int)((ulong)uVar5 >> 0x20);
  return VVar9;
}

Assistant:

RMAPI Vector4 Vector4Normalize(Vector4 v)
{
    Vector4 result = { 0 };
    float length = sqrtf((v.x*v.x) + (v.y*v.y) + (v.z*v.z) + (v.w*v.w));

    if (length > 0)
    {
        float ilength = 1.0f/length;
        result.x = v.x*ilength;
        result.y = v.y*ilength;
        result.z = v.z*ilength;
        result.w = v.w*ilength;
    }

    return result;
}